

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_normal(REF_GRID ref_grid,REF_INT node,REF_DBL *normal)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  double local_150;
  double local_140;
  double local_138;
  double local_128;
  double local_120;
  double local_110;
  REF_INT local_104;
  REF_INT local_100;
  int local_fc;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL tri_norm [3];
  double local_c8;
  REF_DBL area;
  REF_DBL total;
  REF_INT nodes [27];
  REF_INT local_40;
  int local_3c;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *normal_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  *normal = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  area = 0.0;
  if ((node < 0) || (ref_cell_00->ref_adj->nnode <= node)) {
    local_fc = -1;
  }
  else {
    local_fc = ref_cell_00->ref_adj->first[node];
  }
  local_3c = local_fc;
  if (local_fc == -1) {
    local_100 = -1;
  }
  else {
    local_100 = ref_cell_00->ref_adj->item[local_fc].ref;
  }
  local_40 = local_100;
  while( true ) {
    if (local_3c == -1) {
      if (area * 1e+20 <= 0.0) {
        local_110 = -(area * 1e+20);
      }
      else {
        local_110 = area * 1e+20;
      }
      if (*normal <= 0.0) {
        local_120 = -*normal;
      }
      else {
        local_120 = *normal;
      }
      if (local_120 < local_110) {
        if (area * 1e+20 <= 0.0) {
          local_128 = -(area * 1e+20);
        }
        else {
          local_128 = area * 1e+20;
        }
        if (normal[1] <= 0.0) {
          local_138 = -normal[1];
        }
        else {
          local_138 = normal[1];
        }
        if (local_138 < local_128) {
          if (area * 1e+20 <= 0.0) {
            local_140 = -(area * 1e+20);
          }
          else {
            local_140 = area * 1e+20;
          }
          if (normal[2] <= 0.0) {
            local_150 = -normal[2];
          }
          else {
            local_150 = normal[2];
          }
          if (local_150 < local_140) {
            *normal = *normal / area;
            normal[1] = normal[1] / area;
            normal[2] = normal[2] / area;
            uVar1 = ref_math_normalize(normal);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x5c5,"ref_recon_normal",(ulong)uVar1,"norm");
              return uVar1;
            }
            return 0;
          }
        }
      }
      *normal = 0.0;
      normal[1] = 0.0;
      normal[2] = 0.0;
      return 4;
    }
    uVar1 = ref_cell_nodes(ref_cell_00,local_40,(REF_INT *)&total);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x5b7
             ,"ref_recon_normal",(ulong)uVar1,"cell nodes");
      return uVar1;
    }
    uVar1 = ref_node_tri_normal(ref_node_00,(REF_INT *)&total,
                                (REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) break;
    uVar1 = ref_node_tri_area(ref_node_00,(REF_INT *)&total,&local_c8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x5b9
             ,"ref_recon_normal",(ulong)uVar1,"area");
      return uVar1;
    }
    *normal = local_c8 * _ref_private_macro_code_rss_1 + *normal;
    normal[1] = local_c8 * tri_norm[0] + normal[1];
    normal[2] = local_c8 * tri_norm[1] + normal[2];
    area = local_c8 + area;
    local_3c = ref_cell_00->ref_adj->item[local_3c].next;
    if (local_3c == -1) {
      local_104 = -1;
    }
    else {
      local_104 = ref_cell_00->ref_adj->item[local_3c].ref;
    }
    local_40 = local_104;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x5b8,
         "ref_recon_normal",(ulong)uVar1,"cell nodes");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_recon_normal(REF_GRID ref_grid, REF_INT node,
                                    REF_DBL *normal) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL total, area, tri_norm[3];

  normal[0] = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  total = 0.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, tri_norm), "cell nodes");
    RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
    normal[0] += area * tri_norm[0];
    normal[1] += area * tri_norm[1];
    normal[2] += area * tri_norm[2];
    total += area;
  }
  if (ref_math_divisible(normal[0], total) &&
      ref_math_divisible(normal[1], total) &&
      ref_math_divisible(normal[2], total)) {
    normal[0] /= total;
    normal[1] /= total;
    normal[2] /= total;
    RSS(ref_math_normalize(normal), "norm");
  } else {
    normal[0] = 0.0;
    normal[1] = 0.0;
    normal[2] = 0.0;
    return REF_DIV_ZERO;
  }
  return REF_SUCCESS;
}